

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_encoder.cc
# Opt level: O0

int anon_unknown.dwarf_8bad::EncodeMeshToFile(Mesh *mesh,string *file,ExpertEncoder *encoder)

{
  bool bVar1;
  char *pcVar2;
  size_t buffer_size;
  undefined8 uVar3;
  int64_t iVar4;
  Status status;
  EncoderBuffer buffer;
  CycleTimer timer;
  EncoderBuffer *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  DracoTimer local_40;
  int local_4;
  
  draco::DracoTimer::DracoTimer(&local_40);
  draco::EncoderBuffer::EncoderBuffer(in_stack_ffffffffffffff20);
  draco::DracoTimer::Start((DracoTimer *)0x112615);
  draco::ExpertEncoder::EncodeToBuffer
            ((ExpertEncoder *)in_stack_ffffffffffffff78,(EncoderBuffer *)in_stack_ffffffffffffff70);
  bVar1 = draco::Status::ok((Status *)&stack0xffffffffffffff58);
  if (bVar1) {
    draco::DracoTimer::Stop((DracoTimer *)0x1126e3);
    pcVar2 = draco::EncoderBuffer::data((EncoderBuffer *)0x1126ef);
    buffer_size = draco::EncoderBuffer::size((EncoderBuffer *)0x112700);
    bVar1 = draco::WriteBufferToFile
                      (pcVar2,buffer_size,
                       (string *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    if (bVar1) {
      uVar3 = std::__cxx11::string::c_str();
      iVar4 = draco::DracoTimer::GetInMs(&local_40);
      printf("Encoded mesh saved to %s (%ld ms to encode).\n",uVar3,iVar4);
      in_stack_ffffffffffffff20 =
           (EncoderBuffer *)draco::EncoderBuffer::size((EncoderBuffer *)0x11279d);
      printf("\nEncoded size = %zu bytes\n\n",in_stack_ffffffffffffff20);
      local_4 = 0;
    }
    else {
      printf("Failed to create the output file.\n");
      local_4 = -1;
    }
  }
  else {
    printf("Failed to encode the mesh.\n");
    pcVar2 = draco::Status::error_msg((Status *)0x112668);
    printf("%s\n",pcVar2);
    local_4 = -1;
  }
  draco::Status::~Status((Status *)0x1127d6);
  draco::EncoderBuffer::~EncoderBuffer(in_stack_ffffffffffffff20);
  draco::DracoTimer::~DracoTimer(&local_40);
  return local_4;
}

Assistant:

int EncodeMeshToFile(const draco::Mesh &mesh, const std::string &file,
                     draco::ExpertEncoder *encoder) {
  draco::CycleTimer timer;
  // Encode the geometry.
  draco::EncoderBuffer buffer;
  timer.Start();
  const draco::Status status = encoder->EncodeToBuffer(&buffer);
  if (!status.ok()) {
    printf("Failed to encode the mesh.\n");
    printf("%s\n", status.error_msg());
    return -1;
  }
  timer.Stop();
  // Save the encoded geometry into a file.
  if (!draco::WriteBufferToFile(buffer.data(), buffer.size(), file)) {
    printf("Failed to create the output file.\n");
    return -1;
  }
  printf("Encoded mesh saved to %s (%" PRId64 " ms to encode).\n", file.c_str(),
         timer.GetInMs());
  printf("\nEncoded size = %zu bytes\n\n", buffer.size());
  return 0;
}